

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_util.c
# Opt level: O0

void ossl_prov_cache_exported_algorithms(OSSL_ALGORITHM_CAPABLE *in,OSSL_ALGORITHM *out)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  long *in_RSI;
  long in_RDI;
  int j;
  int i;
  int local_18;
  int local_14;
  
  if (*in_RSI == 0) {
    local_18 = 0;
    local_14 = 0;
    while (*(long *)(in_RDI + (long)local_14 * 0x28) != 0) {
      if (*(long *)(in_RDI + (long)local_14 * 0x28 + 0x20) == 0) {
LAB_002e8fb8:
        plVar2 = in_RSI + (long)local_18 * 4;
        plVar3 = (long *)(in_RDI + (long)local_14 * 0x28);
        *plVar2 = *plVar3;
        plVar2[1] = plVar3[1];
        plVar2[2] = plVar3[2];
        plVar2[3] = plVar3[3];
        local_18 = local_18 + 1;
      }
      else {
        iVar1 = (**(code **)(in_RDI + (long)local_14 * 0x28 + 0x20))();
        if (iVar1 != 0) goto LAB_002e8fb8;
      }
      local_14 = local_14 + 1;
    }
    plVar2 = in_RSI + (long)local_18 * 4;
    plVar3 = (long *)(in_RDI + (long)local_14 * 0x28);
    *plVar2 = *plVar3;
    plVar2[1] = plVar3[1];
    plVar2[2] = plVar3[2];
    plVar2[3] = plVar3[3];
  }
  return;
}

Assistant:

void ossl_prov_cache_exported_algorithms(const OSSL_ALGORITHM_CAPABLE *in,
                                         OSSL_ALGORITHM *out)
{
    int i, j;

    if (out[0].algorithm_names == NULL) {
        for (i = j = 0; in[i].alg.algorithm_names != NULL; ++i) {
            if (in[i].capable == NULL || in[i].capable())
                out[j++] = in[i].alg;
        }
        out[j++] = in[i].alg;
    }
}